

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

void decaf_sha512_final(decaf_sha512_ctx_s *ctx,uint8_t *out,size_t length)

{
  char cVar1;
  byte bVar5;
  byte bVar9;
  short sVar11;
  ushort uVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  unkbyte10 Var17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  uint uVar20;
  undefined4 uVar21;
  short sVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 extraout_XMM0_Be;
  uint8_t uVar26;
  undefined1 extraout_XMM0_Bf;
  uint8_t uVar27;
  undefined1 extraout_XMM0_Bg;
  uint8_t uVar28;
  undefined1 extraout_XMM0_Bh;
  uint8_t uVar29;
  undefined1 extraout_XMM0_Bi;
  uint8_t uVar30;
  undefined1 extraout_XMM0_Bj;
  uint8_t uVar31;
  undefined1 extraout_XMM0_Bk;
  uint8_t uVar32;
  char cVar33;
  undefined1 extraout_XMM0_Bl;
  uint8_t uVar34;
  undefined1 extraout_XMM0_Bm;
  uint8_t uVar35;
  char cVar36;
  undefined1 extraout_XMM0_Bn;
  uint8_t uVar37;
  undefined1 extraout_XMM0_Bo;
  uint8_t uVar38;
  undefined1 extraout_XMM0_Bp;
  uint8_t uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  ulong uVar43;
  undefined1 auVar44 [14];
  ulong uVar45;
  char cVar2;
  byte bVar3;
  char cVar4;
  byte bVar6;
  char cVar7;
  char cVar8;
  byte bVar10;
  
  if (length < 0x41) {
    uVar24 = (ulong)((uint)ctx->bytes_processed & 0x7f);
    uVar25 = ctx->bytes_processed << 3;
    ctx->block[uVar24] = 0x80;
    memset(ctx->block + uVar24 + 1,0,uVar24 ^ 0x7f);
    if (0x6f < uVar24) {
      hashblock(ctx);
      uVar20 = CONCAT13(extraout_XMM0_Bh,
                        CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
               CONCAT13(extraout_XMM0_Bh,
                        CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
      uVar26 = (uint8_t)uVar20;
      uVar27 = (uint8_t)(uVar20 >> 8);
      uVar28 = (uint8_t)(uVar20 >> 0x10);
      uVar29 = (uint8_t)(uVar20 >> 0x18);
      uVar20 = CONCAT13(extraout_XMM0_Bl,
                        CONCAT12(extraout_XMM0_Bk,CONCAT11(extraout_XMM0_Bj,extraout_XMM0_Bi))) ^
               CONCAT13(extraout_XMM0_Bl,
                        CONCAT12(extraout_XMM0_Bk,CONCAT11(extraout_XMM0_Bj,extraout_XMM0_Bi)));
      uVar30 = (uint8_t)uVar20;
      uVar31 = (uint8_t)(uVar20 >> 8);
      uVar32 = (uint8_t)(uVar20 >> 0x10);
      uVar34 = (uint8_t)(uVar20 >> 0x18);
      uVar20 = CONCAT13(extraout_XMM0_Bp,
                        CONCAT12(extraout_XMM0_Bo,CONCAT11(extraout_XMM0_Bn,extraout_XMM0_Bm))) ^
               CONCAT13(extraout_XMM0_Bp,
                        CONCAT12(extraout_XMM0_Bo,CONCAT11(extraout_XMM0_Bn,extraout_XMM0_Bm)));
      uVar35 = (uint8_t)uVar20;
      uVar37 = (uint8_t)(uVar20 >> 8);
      uVar38 = (uint8_t)(uVar20 >> 0x10);
      uVar39 = (uint8_t)(uVar20 >> 0x18);
      ctx->block[0x70] = '\0';
      ctx->block[0x71] = '\0';
      ctx->block[0x72] = '\0';
      ctx->block[0x73] = '\0';
      ctx->block[0x74] = uVar26;
      ctx->block[0x75] = uVar27;
      ctx->block[0x76] = uVar28;
      ctx->block[0x77] = uVar29;
      ctx->block[0x78] = uVar30;
      ctx->block[0x79] = uVar31;
      ctx->block[0x7a] = uVar32;
      ctx->block[0x7b] = uVar34;
      ctx->block[0x7c] = uVar35;
      ctx->block[0x7d] = uVar37;
      ctx->block[0x7e] = uVar38;
      ctx->block[0x7f] = uVar39;
      ctx->block[0x60] = '\0';
      ctx->block[0x61] = '\0';
      ctx->block[0x62] = '\0';
      ctx->block[99] = '\0';
      ctx->block[100] = uVar26;
      ctx->block[0x65] = uVar27;
      ctx->block[0x66] = uVar28;
      ctx->block[0x67] = uVar29;
      ctx->block[0x68] = uVar30;
      ctx->block[0x69] = uVar31;
      ctx->block[0x6a] = uVar32;
      ctx->block[0x6b] = uVar34;
      ctx->block[0x6c] = uVar35;
      ctx->block[0x6d] = uVar37;
      ctx->block[0x6e] = uVar38;
      ctx->block[0x6f] = uVar39;
      ctx->block[0x50] = '\0';
      ctx->block[0x51] = '\0';
      ctx->block[0x52] = '\0';
      ctx->block[0x53] = '\0';
      ctx->block[0x54] = uVar26;
      ctx->block[0x55] = uVar27;
      ctx->block[0x56] = uVar28;
      ctx->block[0x57] = uVar29;
      ctx->block[0x58] = uVar30;
      ctx->block[0x59] = uVar31;
      ctx->block[0x5a] = uVar32;
      ctx->block[0x5b] = uVar34;
      ctx->block[0x5c] = uVar35;
      ctx->block[0x5d] = uVar37;
      ctx->block[0x5e] = uVar38;
      ctx->block[0x5f] = uVar39;
      ctx->block[0x40] = '\0';
      ctx->block[0x41] = '\0';
      ctx->block[0x42] = '\0';
      ctx->block[0x43] = '\0';
      ctx->block[0x44] = uVar26;
      ctx->block[0x45] = uVar27;
      ctx->block[0x46] = uVar28;
      ctx->block[0x47] = uVar29;
      ctx->block[0x48] = uVar30;
      ctx->block[0x49] = uVar31;
      ctx->block[0x4a] = uVar32;
      ctx->block[0x4b] = uVar34;
      ctx->block[0x4c] = uVar35;
      ctx->block[0x4d] = uVar37;
      ctx->block[0x4e] = uVar38;
      ctx->block[0x4f] = uVar39;
      ctx->block[0x30] = '\0';
      ctx->block[0x31] = '\0';
      ctx->block[0x32] = '\0';
      ctx->block[0x33] = '\0';
      ctx->block[0x34] = uVar26;
      ctx->block[0x35] = uVar27;
      ctx->block[0x36] = uVar28;
      ctx->block[0x37] = uVar29;
      ctx->block[0x38] = uVar30;
      ctx->block[0x39] = uVar31;
      ctx->block[0x3a] = uVar32;
      ctx->block[0x3b] = uVar34;
      ctx->block[0x3c] = uVar35;
      ctx->block[0x3d] = uVar37;
      ctx->block[0x3e] = uVar38;
      ctx->block[0x3f] = uVar39;
      ctx->block[0x20] = '\0';
      ctx->block[0x21] = '\0';
      ctx->block[0x22] = '\0';
      ctx->block[0x23] = '\0';
      ctx->block[0x24] = uVar26;
      ctx->block[0x25] = uVar27;
      ctx->block[0x26] = uVar28;
      ctx->block[0x27] = uVar29;
      ctx->block[0x28] = uVar30;
      ctx->block[0x29] = uVar31;
      ctx->block[0x2a] = uVar32;
      ctx->block[0x2b] = uVar34;
      ctx->block[0x2c] = uVar35;
      ctx->block[0x2d] = uVar37;
      ctx->block[0x2e] = uVar38;
      ctx->block[0x2f] = uVar39;
      ctx->block[0x10] = '\0';
      ctx->block[0x11] = '\0';
      ctx->block[0x12] = '\0';
      ctx->block[0x13] = '\0';
      ctx->block[0x14] = uVar26;
      ctx->block[0x15] = uVar27;
      ctx->block[0x16] = uVar28;
      ctx->block[0x17] = uVar29;
      ctx->block[0x18] = uVar30;
      ctx->block[0x19] = uVar31;
      ctx->block[0x1a] = uVar32;
      ctx->block[0x1b] = uVar34;
      ctx->block[0x1c] = uVar35;
      ctx->block[0x1d] = uVar37;
      ctx->block[0x1e] = uVar38;
      ctx->block[0x1f] = uVar39;
      ctx->block[0] = '\0';
      ctx->block[1] = '\0';
      ctx->block[2] = '\0';
      ctx->block[3] = '\0';
      ctx->block[4] = uVar26;
      ctx->block[5] = uVar27;
      ctx->block[6] = uVar28;
      ctx->block[7] = uVar29;
      ctx->block[8] = uVar30;
      ctx->block[9] = uVar31;
      ctx->block[10] = uVar32;
      ctx->block[0xb] = uVar34;
      ctx->block[0xc] = uVar35;
      ctx->block[0xd] = uVar37;
      ctx->block[0xe] = uVar38;
      ctx->block[0xf] = uVar39;
    }
    auVar42._0_8_ = uVar25 >> 8;
    auVar42._8_8_ = uVar25;
    auVar42 = auVar42 & _DAT_001182b0;
    uVar43 = (ulong)DAT_001182b0;
    uVar24 = uVar25 >> 0x18 & uVar43;
    uVar45 = DAT_001182b0._8_8_;
    uVar40 = uVar25 >> 0x10 & uVar45;
    cVar33 = (char)(uVar40 >> 0x10);
    cVar36 = (char)(uVar40 >> 0x20);
    Var17 = CONCAT19((char)(uVar40 >> 8),CONCAT18((char)uVar40,uVar24));
    auVar18[10] = cVar33;
    auVar18._0_10_ = Var17;
    auVar18[0xb] = (char)(uVar40 >> 0x18);
    auVar19[0xc] = cVar36;
    auVar19._0_12_ = auVar18;
    auVar19[0xd] = (char)(uVar40 >> 0x28);
    sVar11 = (short)uVar24;
    cVar1 = (0 < sVar11) * (sVar11 < 0x100) * (char)uVar24 - (0xff < sVar11);
    sVar11 = (short)(uVar24 >> 0x10);
    uVar12 = (ushort)(uVar24 >> 0x20);
    bVar23 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar24 >> 0x20) - (0xff < uVar12);
    sVar13 = (short)((unkuint10)Var17 >> 0x40);
    cVar2 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar40 - (0xff < sVar13);
    sVar14 = auVar18._10_2_;
    sVar13 = auVar19._12_2_;
    bVar3 = (0 < sVar13) * (sVar13 < 0x100) * cVar36 - (0xff < sVar13);
    sVar13 = auVar42._0_2_;
    cVar36 = (0 < sVar13) * (sVar13 < 0x100) * auVar42[0] - (0xff < sVar13);
    sVar15 = auVar42._2_2_;
    sVar13 = auVar42._4_2_;
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar42[4] - (0xff < sVar13);
    sVar16 = auVar42._6_2_;
    uVar40 = uVar25 >> 0x28 & uVar43;
    uVar41 = (ulong)(((unkuint9)(uint)(uVar25 >> 0x20) << 0x28) >> 0x28) & uVar45;
    uVar43 = uVar25 >> 0x38 & uVar43;
    uVar45 = (ulong)(((unkuint9)(ushort)(uVar25 >> 0x30) << 0x38) >> 0x38) & uVar45;
    uVar12 = (ushort)uVar43;
    bVar5 = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar43 - (0xff < uVar12);
    sVar13 = (short)uVar45;
    bVar6 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar45 - (0xff < sVar13);
    sVar13 = (short)uVar40;
    cVar7 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar40 - (0xff < sVar13);
    uVar12 = (ushort)(uVar40 >> 0x10);
    uVar12 = CONCAT11((uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar40 >> 0x10) - (0xff < uVar12),
                      cVar7);
    auVar44._0_12_ = ZEXT212(uVar12) << 0x40;
    sVar13 = (short)uVar41;
    cVar8 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar41 - (0xff < sVar13);
    auVar44[0xc] = cVar8;
    sVar13 = (short)(uVar41 >> 0x10);
    auVar44[0xd] = (0 < sVar13) * (sVar13 < 0x100) * (char)(uVar41 >> 0x10) - (0xff < sVar13);
    sVar13 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < sVar11),
                      cVar1);
    sVar22 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * cVar33 - (0xff < sVar14),cVar2);
    sVar14 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar42[2] - (0xff < sVar15),cVar36);
    bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar9 = (0 < (short)uVar12) * ((short)uVar12 < 0x100) * cVar7 - (0xff < (short)uVar12);
    sVar11 = auVar44._12_2_;
    bVar10 = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
    cVar1 = (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13);
    sVar15 = CONCAT11((bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23),cVar1);
    cVar2 = (0 < sVar22) * (sVar22 < 0x100) * cVar2 - (0xff < sVar22);
    uVar21 = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),CONCAT12(cVar2,sVar15)
                     );
    cVar36 = (0 < sVar14) * (sVar14 < 0x100) * cVar36 - (0xff < sVar14);
    sVar13 = (short)(CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar42[6] - (0xff < sVar16),
                              CONCAT12(cVar4,sVar14)) >> 0x10);
    sVar11 = (short)((uint)uVar21 >> 0x10);
    sVar13 = (short)(CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar4 - (0xff < sVar13),
                              CONCAT14(cVar36,uVar21)) >> 0x20);
    *(ulong *)(ctx->block + 0x78) =
         (ulong)CONCAT16((0 < sVar13) * (sVar13 < 0x100) * cVar36 - (0xff < sVar13),
                         CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar2 - (0xff < sVar11),
                                  CONCAT14((0 < sVar15) * (sVar15 < 0x100) * cVar1 - (0xff < sVar15)
                                           ,CONCAT13((bVar10 != 0) * (bVar10 < 0x100) * bVar10 -
                                                     (0xff < bVar10),
                                                     CONCAT12((bVar9 != 0) * (bVar9 < 0x100) * bVar9
                                                              - (0xff < bVar9),
                                                              CONCAT11((bVar6 != 0) *
                                                                       (bVar6 < 0x100) * bVar6 -
                                                                       (0xff < bVar6),
                                                                       (bVar5 != 0) *
                                                                       (bVar5 < 0x100) * bVar5 -
                                                                       (0xff < bVar5)))))));
    hashblock(ctx);
    if (length != 0) {
      bVar23 = 0;
      uVar24 = 0;
      do {
        out[uVar24] = (uint8_t)(*(ulong *)((long)ctx->state + (uVar24 & 0xfffffffffffffff8)) >>
                               (~bVar23 & 0x38));
        uVar24 = uVar24 + 1;
        bVar23 = bVar23 + 8;
      } while (length != uVar24);
    }
    ctx->state[6] = 0x1f83d9abfb41bd6b;
    ctx->state[7] = 0x5be0cd19137e2179;
    ctx->state[4] = 0x510e527fade682d1;
    ctx->state[5] = 0x9b05688c2b3e6c1f;
    ctx->state[2] = 0x3c6ef372fe94f82b;
    ctx->state[3] = 0xa54ff53a5f1d36f1;
    ctx->state[0] = 0x6a09e667f3bcc908;
    ctx->state[1] = 0xbb67ae8584caa73b;
    memset(ctx->block,0,0x88);
    return;
  }
  __assert_fail("length <= 512/8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/sha512.c"
                ,0xe9,"void decaf_sha512_final(struct decaf_sha512_ctx_s *, uint8_t *, size_t)");
}

Assistant:

void decaf_sha512_final(decaf_sha512_ctx_t ctx, uint8_t *out, size_t length) {
    assert(length <= 512/8);
    
    size_t off = ctx->bytes_processed % 128;
    uint64_t bp = ctx->bytes_processed * 8;
    ctx->block[off] = 0x80;
    memset(&ctx->block[off+1], 0, 128-off-1);
    
    if (off >= 112) {
        hashblock(ctx);
        memset(&ctx->block,0,128);
    }
    
    for (size_t i=0; i<8; i++)
        ctx->block[120 + i] = (uint8_t)(bp >> (56 - 8*i));
    hashblock(ctx);
    
    for (size_t i=0; i<length; i++) {
        out[i] = (uint8_t)(ctx->state[i/8] >> (56 - 8*(i%8)));
    }
    
    decaf_sha512_init(ctx);
}